

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementTetraCorot_10::ComputeStiffnessMatrix(ChElementTetraCorot_10 *this)

{
  ChMatrixDynamic<> *dst;
  element_type *peVar1;
  pointer pMVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  Index index;
  ulong uVar8;
  ActualDstType actualDst_1;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  double JacobianDet;
  type tmp_1;
  ChMatrixDynamic<> temp;
  ChMatrixNM<double,_4,_4> tmp;
  assign_op<double,_double> local_189;
  double local_188;
  Matrix<double,__1,__1,_1,__1,__1> local_180;
  Matrix<double,__1,__1,_1,__1,__1> local_160;
  undefined1 auStack_146 [4];
  undefined1 auStack_142 [2];
  SrcXprType local_140;
  Matrix<double,_4,_4,_1,_4,_4> local_100;
  
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_140);
  lVar5 = 0;
  do {
    *(undefined8 *)
     ((long)local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array + lVar5 * 4) = *(undefined8 *)(&local_140.field_0x0 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_140);
  lVar5 = 2;
  do {
    *(undefined8 *)
     ((long)local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array + lVar5 * 4) = *(undefined8 *)(auStack_146 + lVar5 + 4);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x1a);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_140);
  lVar5 = 4;
  do {
    *(undefined8 *)
     ((long)local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array + lVar5 * 4) = *(undefined8 *)(auStack_146 + lVar5 + 2);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x1c);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_140);
  lVar5 = 6;
  do {
    *(undefined8 *)
     ((long)local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array + lVar5 * 4) = *(undefined8 *)(auStack_146 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x1e);
  local_140._0_8_ = &local_100;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xc]
       = 1.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xd]
       = 1.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xe]
       = 1.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xf]
       = 1.0;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&this->mM,(SrcXprType *)&local_140,(assign_op<double,_double> *)&local_180);
  local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[0xb])
            (0x3fe2bbae2bf7d58f,0x3fc1b06d1ab58dec,0x3fc1b06d1ab58dec,0x3fc1b06d1ab58dec,this,
             (this->MatrB).
             super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_188);
  peVar1 = (this->Material).
           super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pMVar2 = (this->MatrB).
           super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
          m_rows;
  if (lVar5 != (peVar1->StressStrainMatrix).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows) {
LAB_006c0a6d:
    pcVar7 = 
    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
    ;
LAB_006c0a99:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar7);
  }
  if ((peVar1->StressStrainMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
      m_storage.m_cols != lVar5) {
LAB_006c0a84:
    pcVar7 = 
    "Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
    ;
    goto LAB_006c0a99;
  }
  lVar5 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
          m_cols;
  if (-1 < lVar5) {
    local_140.m_lhs.m_functor.m_other = (local_188 / 6.0) * 0.0625;
    local_140.m_rhs.m_lhs.m_rhs = &peVar1->StressStrainMatrix;
    local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
    local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
    local_140.m_lhs.m_rows.m_value = lVar5;
    local_140.m_lhs.m_cols.m_value = lVar5;
    local_140.m_rhs.m_lhs.m_lhs.m_matrix = pMVar2;
    local_140.m_rhs.m_rhs = pMVar2;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_180,&local_140,&local_189);
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
              (&local_160,&local_180,&local_189);
    if (local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        != (double *)0x0) {
      free((void *)local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data[-1]);
    }
    dst = &this->StiffnessMatrix;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
              (dst,&local_160,(assign_op<double,_double> *)&local_140);
    (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[0xb])
              (0x3fc1b06d1ab58dec,0x3fe2bbae2bf7d58f,0x3fc1b06d1ab58dec,0x3fc1b06d1ab58dec,this,
               (this->MatrB).
               super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1,&local_188);
    peVar1 = (this->Material).
             super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pMVar2 = (this->MatrB).
             super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = pMVar2[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows;
    if (lVar5 != (peVar1->StressStrainMatrix).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows)
    goto LAB_006c0a6d;
    if ((peVar1->StressStrainMatrix).
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols != lVar5)
    goto LAB_006c0a84;
    lVar5 = pMVar2[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols;
    if (-1 < lVar5) {
      local_140.m_lhs.m_functor.m_other = (local_188 / 6.0) * 0.0625;
      local_140.m_rhs.m_lhs.m_lhs.m_matrix = pMVar2 + 1;
      local_140.m_rhs.m_lhs.m_rhs = &peVar1->StressStrainMatrix;
      local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
           0;
      local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
           0;
      local_140.m_lhs.m_rows.m_value = lVar5;
      local_140.m_lhs.m_cols.m_value = lVar5;
      local_140.m_rhs.m_rhs = local_140.m_rhs.m_lhs.m_lhs.m_matrix;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(&local_180,&local_140,&local_189);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
                (&local_160,&local_180,&local_189);
      if (local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_data != (double *)0x0) {
        free((void *)local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_data[-1]);
      }
      lVar5 = (this->StiffnessMatrix).
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
      if ((lVar5 != local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_rows) ||
         (lVar3 = (this->StiffnessMatrix).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols,
         lVar3 != local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols)) {
LAB_006c0a4e:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                     );
      }
      pdVar4 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
               m_data;
      uVar6 = lVar3 * lVar5;
      uVar8 = uVar6 + 7;
      if (-1 < (long)uVar6) {
        uVar8 = uVar6;
      }
      uVar8 = uVar8 & 0xfffffffffffffff8;
      if (7 < (long)uVar6) {
        lVar5 = 0;
        do {
          auVar9 = vaddpd_avx512f(*(undefined1 (*) [64])
                                   (local_160.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                    .m_storage.m_data + lVar5),
                                  *(undefined1 (*) [64])(pdVar4 + lVar5));
          *(undefined1 (*) [64])(pdVar4 + lVar5) = auVar9;
          lVar5 = lVar5 + 8;
        } while (lVar5 < (long)uVar8);
      }
      if ((long)uVar8 < (long)uVar6) {
        do {
          pdVar4[uVar8] =
               local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_data[uVar8] + pdVar4[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar6 - uVar8 != 0);
      }
      (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[0xb])
                (this,(this->MatrB).
                      super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 2,&local_188);
      peVar1 = (this->Material).
               super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pMVar2 = (this->MatrB).
               super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = pMVar2[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_rows;
      if (lVar5 != (peVar1->StressStrainMatrix).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
         ) goto LAB_006c0a6d;
      if ((peVar1->StressStrainMatrix).
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols != lVar5
         ) goto LAB_006c0a84;
      lVar5 = pMVar2[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_cols;
      if (-1 < lVar5) {
        local_140.m_lhs.m_functor.m_other = (local_188 / 6.0) * 0.0625;
        local_140.m_rhs.m_lhs.m_lhs.m_matrix = pMVar2 + 2;
        local_140.m_rhs.m_lhs.m_rhs = &peVar1->StressStrainMatrix;
        local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
             = (double *)0x0;
        local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
             = 0;
        local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
             = 0;
        local_140.m_lhs.m_rows.m_value = lVar5;
        local_140.m_lhs.m_cols.m_value = lVar5;
        local_140.m_rhs.m_rhs = local_140.m_rhs.m_lhs.m_lhs.m_matrix;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run(&local_180,&local_140,&local_189);
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
                  (&local_160,&local_180,&local_189);
        if (local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_data != (double *)0x0) {
          free((void *)local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                       m_storage.m_data[-1]);
        }
        lVar5 = (this->StiffnessMatrix).
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
        if ((lVar5 != local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_rows) ||
           (lVar3 = (this->StiffnessMatrix).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                    m_cols,
           lVar3 != local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols)) goto LAB_006c0a4e;
        pdVar4 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                 m_data;
        uVar6 = lVar3 * lVar5;
        uVar8 = uVar6 + 7;
        if (-1 < (long)uVar6) {
          uVar8 = uVar6;
        }
        uVar8 = uVar8 & 0xfffffffffffffff8;
        if (7 < (long)uVar6) {
          lVar5 = 0;
          do {
            auVar9 = vaddpd_avx512f(*(undefined1 (*) [64])
                                     (local_160.
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                      .m_storage.m_data + lVar5),
                                    *(undefined1 (*) [64])(pdVar4 + lVar5));
            *(undefined1 (*) [64])(pdVar4 + lVar5) = auVar9;
            lVar5 = lVar5 + 8;
          } while (lVar5 < (long)uVar8);
        }
        if ((long)uVar8 < (long)uVar6) {
          do {
            pdVar4[uVar8] =
                 local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_data[uVar8] + pdVar4[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar6 - uVar8 != 0);
        }
        (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[0xb])
                  (this,(this->MatrB).
                        super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 3,&local_188);
        peVar1 = (this->Material).
                 super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        pMVar2 = (this->MatrB).
                 super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = pMVar2[3].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                .m_rows;
        if (lVar5 != (peVar1->StressStrainMatrix).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                     m_rows) goto LAB_006c0a6d;
        if ((peVar1->StressStrainMatrix).
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols !=
            lVar5) goto LAB_006c0a84;
        lVar5 = pMVar2[3].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                .m_cols;
        if (-1 < lVar5) {
          local_140.m_lhs.m_functor.m_other = (local_188 / 6.0) * 0.0625;
          local_140.m_rhs.m_lhs.m_lhs.m_matrix = pMVar2 + 3;
          local_140.m_rhs.m_lhs.m_rhs = &peVar1->StressStrainMatrix;
          local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_data = (double *)0x0;
          local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows = 0;
          local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_cols = 0;
          local_140.m_lhs.m_rows.m_value = lVar5;
          local_140.m_lhs.m_cols.m_value = lVar5;
          local_140.m_rhs.m_rhs = local_140.m_rhs.m_lhs.m_lhs.m_matrix;
          Eigen::internal::
          Assignment<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
          ::run(&local_180,&local_140,&local_189);
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
                    (&local_160,&local_180,&local_189);
          if (local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_data != (double *)0x0) {
            free((void *)local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                         m_storage.m_data[-1]);
          }
          lVar5 = (this->StiffnessMatrix).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
          if ((lVar5 != local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                        m_storage.m_rows) ||
             (lVar3 = (this->StiffnessMatrix).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_cols,
             lVar3 != local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols)) goto LAB_006c0a4e;
          pdVar4 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage
                   .m_data;
          uVar6 = lVar3 * lVar5;
          uVar8 = uVar6 + 7;
          if (-1 < (long)uVar6) {
            uVar8 = uVar6;
          }
          uVar8 = uVar8 & 0xfffffffffffffff8;
          if (7 < (long)uVar6) {
            lVar5 = 0;
            do {
              auVar9 = vaddpd_avx512f(*(undefined1 (*) [64])
                                       (local_160.
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                        .m_storage.m_data + lVar5),
                                      *(undefined1 (*) [64])(pdVar4 + lVar5));
              *(undefined1 (*) [64])(pdVar4 + lVar5) = auVar9;
              lVar5 = lVar5 + 8;
            } while (lVar5 < (long)uVar8);
          }
          if ((long)uVar8 < (long)uVar6) {
            do {
              pdVar4[uVar8] =
                   local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data[uVar8] + pdVar4[uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar6 - uVar8 != 0);
          }
          uVar8 = (this->StiffnessMatrix).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
          uVar6 = (this->StiffnessMatrix).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols;
          if (-1 < (long)(uVar6 | uVar8)) {
            pdVar4 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                     m_storage.m_data;
            uVar6 = uVar6 * uVar8;
            uVar8 = uVar6 + 7;
            if (-1 < (long)uVar6) {
              uVar8 = uVar6;
            }
            uVar8 = uVar8 & 0xfffffffffffffff8;
            if (7 < (long)uVar6) {
              lVar5 = 0;
              auVar9 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
              do {
                auVar10 = vmulpd_avx512f(auVar9,*(undefined1 (*) [64])(pdVar4 + lVar5));
                *(undefined1 (*) [64])(pdVar4 + lVar5) = auVar10;
                lVar5 = lVar5 + 8;
              } while (lVar5 < (long)uVar8);
            }
            if ((long)uVar8 < (long)uVar6) {
              do {
                pdVar4[uVar8] = pdVar4[uVar8] * 0.5;
                uVar8 = uVar8 + 1;
              } while (uVar6 - uVar8 != 0);
            }
            if (local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                .m_data != (double *)0x0) {
              free((void *)local_160.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_data[-1]);
            }
            return;
          }
          pcVar7 = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
          ;
          goto LAB_006c0ab8;
        }
      }
    }
  }
  pcVar7 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
  ;
LAB_006c0ab8:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar7);
}

Assistant:

void ChElementTetraCorot_10::ComputeStiffnessMatrix() {
    // for speeding up corotational, used later:
    // M = [ X0_0 X0_1 X0_2 X0_3 ] ^-1
    //     [ 1    1    1    1    ]
    ChMatrixNM<double, 4, 4> tmp;
    tmp.block(0, 0, 3, 1) = nodes[0]->GetX0().eigen();
    tmp.block(0, 1, 3, 1) = nodes[1]->GetX0().eigen();
    tmp.block(0, 2, 3, 1) = nodes[2]->GetX0().eigen();
    tmp.block(0, 3, 3, 1) = nodes[3]->GetX0().eigen();
    tmp.row(3).setConstant(1.0);
    mM = tmp.inverse();

    //========================
    // Exact Integration (4 Gp)
    //========================
    ChMatrixDynamic<> temp;

    double zeta1 = 0.58541020;
    double zeta2 = 0.1381966;
    double zeta3 = 0.1381966;
    double zeta4 = 0.1381966;
    double JacobianDet;
    ComputeMatrB(this->MatrB[0], zeta1, zeta2, zeta3, zeta4, JacobianDet);
    temp = (JacobianDet / 6.0 / 16.0) * (MatrB[0].transpose() * Material->Get_StressStrainMatrix() * MatrB[0]);
    // Gauss integration weight = 1*1/4*1/4*1/4
    StiffnessMatrix = temp;

    zeta1 = 0.1381966;
    zeta2 = 0.58541020;
    zeta3 = 0.1381966;
    zeta4 = 0.1381966;
    ComputeMatrB(this->MatrB[1], zeta1, zeta2, zeta3, zeta4, JacobianDet);
    temp = (JacobianDet / 6.0 / 16.0) * (MatrB[1].transpose() * Material->Get_StressStrainMatrix() * MatrB[1]);
    // Gauss integration weight = 1*1/4*1/4*1/4
    StiffnessMatrix += temp;

    zeta1 = 0.1381966;
    zeta2 = 0.1381966;
    zeta3 = 0.58541020;
    zeta4 = 0.1381966;
    ComputeMatrB(this->MatrB[2], zeta1, zeta2, zeta3, zeta4, JacobianDet);
    temp = (JacobianDet / 6.0 / 16.0) * (MatrB[2].transpose() * Material->Get_StressStrainMatrix() * MatrB[2]);
    // Gauss integration weight = 1*1/4*1/4*1/4
    StiffnessMatrix += temp;

    zeta1 = 0.1381966;
    zeta2 = 0.1381966;
    zeta3 = 0.1381966;
    zeta4 = 0.58541020;
    ComputeMatrB(this->MatrB[3], zeta1, zeta2, zeta3, zeta4, JacobianDet);
    temp = (JacobianDet / 6.0 / 16.0) * (MatrB[3].transpose() * Material->Get_StressStrainMatrix() * MatrB[3]);
    // Gauss integration weight = 1*1/4*1/4*1/4
    StiffnessMatrix += temp;

    StiffnessMatrix /= 2;  //!!! => because the canonical interval is -1 ... +1,  but we want to integrate
                           //		 in 0 ... +1 -> we have to multiply by: b-a/2 ( = (1-0)/2 = 1/2)
}